

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O0

char * ht_search(ht_hash_table *ht,char *key)

{
  int iVar1;
  int local_34;
  ht_item *phStack_30;
  int i;
  ht_item *item;
  int index;
  char *key_local;
  ht_hash_table *ht_local;
  
  iVar1 = ht_get_hash(key,ht->size,0);
  phStack_30 = ht->items[iVar1];
  local_34 = 1;
  while( true ) {
    if (phStack_30 == (ht_item *)0x0) {
      return (char *)0x0;
    }
    if ((phStack_30 != &HT_DELETED_ITEM) && (iVar1 = strcmp(phStack_30->key,key), iVar1 == 0))
    break;
    iVar1 = ht_get_hash(key,ht->size,local_34);
    phStack_30 = ht->items[iVar1];
    local_34 = local_34 + 1;
  }
  return phStack_30->value;
}

Assistant:

char* ht_search(ht_hash_table* ht, const char* key) {
    int index = ht_get_hash(key, ht->size, 0);
    ht_item* item = ht->items[index];
    int i = 1;
    while (item != nullptr) {
        if (item != &HT_DELETED_ITEM) {
            if (strcmp(item->key, key) == 0) {
                return item->value;
            }
        }
        index = ht_get_hash(key, ht->size, i);
        item = ht->items[index];
        i++;
    }
    return nullptr;
}